

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Text_Display.cxx
# Opt level: O2

void __thiscall Fl_Text_Display::overstrike(Fl_Text_Display *this,char *text)

{
  int pos;
  Fl_Text_Buffer *this_00;
  int iVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  size_t sVar5;
  long lVar6;
  uint uVar7;
  uint uVar8;
  long lVar9;
  char *pcVar10;
  int iVar11;
  long lVar12;
  bool bVar13;
  
  pos = this->mCursorPos;
  this_00 = this->mBuffer;
  iVar1 = Fl_Text_Buffer::line_start(this_00,pos);
  sVar5 = strlen(text);
  iVar2 = Fl_Text_Buffer::count_displayed_characters(this->mBuffer,iVar1,pos);
  lVar12 = -(long)iVar2;
  uVar7 = 0;
  iVar1 = iVar2;
  for (pcVar10 = text; *pcVar10 != '\0'; pcVar10 = pcVar10 + iVar3) {
    iVar1 = iVar1 + 1;
    iVar3 = fl_utf8len1(*pcVar10);
    uVar7 = uVar7 - 1;
    lVar12 = lVar12 + -1;
  }
  uVar8 = ~uVar7;
  iVar11 = iVar2;
  iVar3 = pos;
  while ((iVar3 != this_00->mLength && (uVar4 = Fl_Text_Buffer::char_at(this_00,iVar3), uVar4 != 10)
         )) {
    bVar13 = uVar8 == 0;
    uVar8 = uVar8 - 1;
    if (bVar13) {
      iVar3 = iVar3 + 1;
LAB_001ce31f:
      pcVar10 = (char *)0x0;
      goto LAB_001ce3b7;
    }
    if ((int)(iVar2 - uVar7) <= iVar11) {
      if (uVar4 != 9) {
        lVar9 = sVar5 << 0x20;
        pcVar10 = (char *)operator_new__(lVar9 + 0x1500000000 >> 0x20);
        strcpy(pcVar10,text);
        if (iVar1 < iVar2) {
          iVar1 = iVar2;
        }
        for (lVar6 = 0; lVar6 < lVar12 + (iVar1 + 1); lVar6 = lVar6 + 1) {
          pcVar10[lVar6 + (int)sVar5] = ' ';
          lVar9 = lVar9 + 0x100000000;
        }
        iVar3 = iVar3 + 1;
        pcVar10[lVar9 >> 0x20] = '\0';
        goto LAB_001ce3b7;
      }
      goto LAB_001ce31f;
    }
    iVar3 = Fl_Text_Buffer::next_char(this->mBuffer,iVar3);
    iVar11 = iVar11 + 1;
  }
  pcVar10 = (char *)0x0;
LAB_001ce3b7:
  this->mCursorToHint = pos + (int)sVar5;
  if (pcVar10 != (char *)0x0) {
    text = pcVar10;
  }
  Fl_Text_Buffer::replace(this_00,pos,iVar3,text);
  this->mCursorToHint = -1;
  if (pcVar10 == (char *)0x0) {
    return;
  }
  operator_delete__(pcVar10);
  return;
}

Assistant:

void Fl_Text_Display::overstrike(const char* text) {
  IS_UTF8_ALIGNED2(buffer(), mCursorPos)
  IS_UTF8_ALIGNED(text)

  int startPos = mCursorPos;
  Fl_Text_Buffer *buf = mBuffer;
  int lineStart = buf->line_start( startPos );
  int textLen = (int) strlen( text );
  int i, p, endPos, indent, startIndent, endIndent;
  const char *c;
  unsigned int ch;
  char *paddedText = NULL;

  /* determine how many displayed character positions are covered */
  startIndent = mBuffer->count_displayed_characters( lineStart, startPos );
  indent = startIndent;
  for ( c = text; *c != '\0'; c += fl_utf8len1(*c) )
    indent++;
  endIndent = indent;

  /* find which characters to remove, and if necessary generate additional
   padding to make up for removed control characters at the end */
  indent = startIndent;
  for ( p = startPos; ; p=buffer()->next_char(p) ) {
    if ( p == buf->length() )
      break;
    ch = buf->char_at( p );
    if ( ch == '\n' )
      break;
    indent++;
    if ( indent == endIndent ) {
      p++;
      break;
    } else if ( indent > endIndent ) {
      if ( ch != '\t' ) {
        p++;
        paddedText = new char [ textLen + FL_TEXT_MAX_EXP_CHAR_LEN + 1 ];
        strcpy( paddedText, text );
        for ( i = 0; i < indent - endIndent; i++ )
          paddedText[ textLen + i ] = ' ';
        paddedText[ textLen + i ] = '\0';
      }
      break;
    }
  }
  endPos = p;

  mCursorToHint = startPos + textLen;
  buf->replace( startPos, endPos, paddedText == NULL ? text : paddedText );
  mCursorToHint = NO_HINT;
  if ( paddedText != NULL )
    delete [] paddedText;
}